

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O3

void __thiscall ProjectWriter::writeDemands(ProjectWriter *this)

{
  undefined1 *puVar1;
  pointer ppNVar2;
  long lVar3;
  Node *pNVar4;
  int iVar5;
  ostream *poVar6;
  pointer ppNVar7;
  Junction *junc;
  undefined8 *puVar8;
  
  puVar1 = &this->field_0x18;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n[DEMANDS]\n",0xb);
  ppNVar2 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar7 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar7 != ppNVar2; ppNVar7 = ppNVar7 + 1) {
    pNVar4 = *ppNVar7;
    iVar5 = (*(pNVar4->super_Element)._vptr_Element[2])(pNVar4);
    if (iVar5 == 0) {
      lVar3 = *(long *)(*(long *)&this->field_0x18 + -0x18);
      *(uint *)(&this->field_0x30 + lVar3) =
           *(uint *)(&this->field_0x30 + lVar3) & 0xffffff4f | 0x20;
      for (puVar8 = (undefined8 *)pNVar4[1].super_Element.name.field_2._M_allocated_capacity;
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8 != &pNVar4[1].super_Element.name.field_2; puVar8 = (undefined8 *)*puVar8) {
        *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)puVar1,(pNVar4->super_Element).name._M_dataplus._M_p,
                            (pNVar4->super_Element).name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        lVar3 = *(long *)&this->field_0x18;
        *(undefined8 *)(&this->field_0x28 + *(long *)(lVar3 + -0x18)) = 0xc;
        *(uint *)(&this->field_0x30 + *(long *)(lVar3 + -0x18)) =
             *(uint *)(&this->field_0x30 + *(long *)(lVar3 + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)(&this->field_0x20 + *(long *)(lVar3 + -0x18)) = 4;
        std::ostream::_M_insert<double>((double)puVar8[2] * (this->network->units).factors[5]);
        lVar3 = puVar8[4];
        if (lVar3 != 0) {
          *(undefined8 *)(&this->field_0x28 + *(long *)(*(long *)&this->field_0x18 + -0x18)) = 0x10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)puVar1,*(char **)(lVar3 + 8),*(long *)(lVar3 + 0x10));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n",1);
      }
    }
  }
  return;
}

Assistant:

void ProjectWriter::writeDemands()
{
    fout << "\n[DEMANDS]\n";
    for (Node* node : network->nodes)
    {
        if ( node->type() == Node::JUNCTION )
    	{
    	    Junction* junc = static_cast<Junction*>(node);
    	    fout << left;
    	    auto demand = junc->demands.begin();
    	    while ( demand != junc->demands.end() )
    	    {
    	        fout << setw(16) << node->name << " ";
    	        fout << setw(12) << fixed << setprecision(4);
    	        fout << demand->baseDemand * network->ucf(Units::FLOW);
    	        if (demand->timePattern != 0)
    	        {
    	            fout << setw(16) << demand->timePattern->name;
    	        }
    	        fout << "\n";
    	        ++demand;
    	    }
    	}
    }
}